

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O2

void __thiscall
HttpdBufferedReader_MaxLengthString_Test::~HttpdBufferedReader_MaxLengthString_Test
          (HttpdBufferedReader_MaxLengthString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (HttpdBufferedReader, MaxLengthString) {
    using pstore::http::max_string_length;
    std::string const max_length_string (max_string_length, 'a');

    refiller r;
    EXPECT_CALL (r, fill (_, _)).WillRepeatedly (Invoke (eof ()));
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string (max_length_string)));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function (), max_string_length);
    error_or_n<int, maybe<std::string>> const s1 = br.gets (io);
    ASSERT_TRUE (static_cast<bool> (s1)) << "Error: " << s1.get_error ();
    maybe<std::string> str1;
    std::tie (io, str1) = *s1;
    ASSERT_TRUE (str1.has_value ());
    EXPECT_EQ (str1.value (), max_length_string);
}